

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.h
# Opt level: O1

void __thiscall
gpu::BlendFilters<unsigned_char>::hardMix
          (BlendFilters<unsigned_char> *this,uchar *baseLayer,uchar *blendLayer,uchar *destination,
          float alpha)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  float fVar5;
  
  uVar4 = (uint)*blendLayer;
  if ((char)*blendLayer < '\0') {
    uVar2 = (uint)(((ulong)*baseLayer << 8) / (ulong)(uVar4 * 2 ^ 0x1ff));
    uVar4 = 0xff;
    if (uVar2 < 0xff) {
      uVar4 = uVar2;
    }
  }
  else if (uVar4 == 0) {
    uVar4 = 0;
  }
  else {
    uVar2 = ((*baseLayer ^ 0xff) << 8) / (uVar4 * 2);
    uVar4 = 0xff - uVar2;
    if (0xff < uVar2) {
      uVar4 = 0;
    }
  }
  iVar3 = 0xff;
  if (uVar4 < 0x80) {
    iVar3 = 0;
  }
  fVar1 = (float)iVar3 * alpha + (float)*baseLayer * (1.0 - alpha);
  fVar5 = 255.0;
  if ((fVar1 <= 255.0) && (fVar5 = fVar1, fVar1 < 0.0)) {
    fVar5 = 0.0;
  }
  *destination = (uchar)(int)fVar5;
  return;
}

Assistant:

FUNCTION_PREFIX void BlendFilters<T>::hardMix(const T& baseLayer,const T& blendLayer, T& destination, float alpha)
    {
      float blendValue=ChannelBlend_HardMix(baseLayer,blendLayer);
      float blendValueNormalized=(1.0-alpha)*baseLayer+alpha*blendValue;
      PIXEL_DOMAIN_CHECK(blendValueNormalized);
      destination=(T)blendValueNormalized;
    }